

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_cargo_zero_or_one_without_arg2(void)

{
  int iVar1;
  undefined4 local_50;
  int local_4c;
  int b;
  int a;
  char *args [4];
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  iVar1 = cargo_init((cargo_t *)(args + 3),0,"program");
  if (iVar1 == 0) {
    _b = "program";
    args[0] = "--alpha";
    args[1] = "--beta";
    args[2] = "3";
    local_4c = 0;
    local_50 = 0;
    cargo_add_option((cargo_t)args[3],0,"--alpha","an option","i?",&local_4c,"5");
    iVar1 = cargo_add_option((cargo_t)args[3],0,"--beta -b","an option","i",&local_50);
    if (iVar1 == 0) {
      iVar1 = cargo_parse((cargo_t)args[3],0,1,4,(char **)&b);
      if (iVar1 == 0) {
        if (local_4c != 5) {
          pcStack_18 = "Unexpected value";
        }
      }
      else {
        pcStack_18 = "Failed parse";
      }
    }
    else {
      pcStack_18 = "Failed to add options";
    }
    cargo_destroy((cargo_t *)(args + 3));
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_cargo_zero_or_one_without_arg2)
{
    char *args[] = { "program", "--alpha", "--beta", "3" };
    int a = 0;
    int b = 0;
    ret = cargo_add_option(cargo, 0, "--alpha", "an option", "i?", &a, "5");
    ret = cargo_add_option(cargo, 0, "--beta -b", "an option", "i", &b);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Failed parse");
    cargo_assert(a == 5, "Unexpected value");

    _TEST_CLEANUP();
}